

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

ofstream * getOutputFile(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  undefined8 in_RDX;
  int iVar2;
  undefined4 in_register_0000003c;
  path local_148;
  undefined1 local_120 [8];
  path outputFile;
  path local_d0;
  undefined1 local_a8 [8];
  path folder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_58;
  int i;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string outputFileName;
  char **argv_local;
  int argc_local;
  ofstream *outFile;
  
  iVar2 = (int)argv;
  outputFileName.field_2._8_8_ = in_RDX;
  std::operator<<((ostream *)&std::cout,"Parsing  command line arguments....\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"out.cpp",&local_41);
  std::allocator<char>::~allocator(&local_41);
  if (1 < iVar2) {
    std::operator<<((ostream *)&std::cout,"Arguments found...\n");
    for (local_58 = 1; local_58 < iVar2; local_58 = local_58 + 1) {
      __s = *(char **)(outputFileName.field_2._8_8_ + (long)local_58 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,__s,
                 (allocator<char> *)
                 ((long)&folder._M_cmpts._M_impl._M_t.
                         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 + 7));
      bVar1 = std::operator==(&local_78,"-o");
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&folder._M_cmpts._M_impl._M_t.
                         super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                 + 7));
      if ((bVar1) && (local_58 + 1 <= iVar2)) {
        std::__cxx11::string::operator=
                  ((string *)local_40,
                   *(char **)(outputFileName.field_2._8_8_ + 8 + (long)local_58 * 8));
      }
    }
  }
  std::operator<<((ostream *)&std::cout,"Finished parsing command line arguments.\n");
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
            ((path *)&outputFile._M_cmpts,(char (*) [12])"glom_output",auto_format);
  std::filesystem::__cxx11::operator/((path *)local_a8,&local_d0,(path *)&outputFile._M_cmpts);
  std::filesystem::__cxx11::path::~path((path *)&outputFile._M_cmpts);
  std::filesystem::__cxx11::path::~path(&local_d0);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_148,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             auto_format);
  std::filesystem::__cxx11::operator/((path *)local_120,(path *)local_a8,&local_148);
  std::filesystem::__cxx11::path::~path(&local_148);
  bVar1 = std::filesystem::exists((path *)local_a8);
  if (!bVar1) {
    std::filesystem::create_directory((path *)local_a8);
  }
  bVar1 = std::filesystem::exists((path *)local_120);
  if (bVar1) {
    std::filesystem::remove((path *)local_120);
  }
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ofstream *)CONCAT44(in_register_0000003c,argc),(path *)local_120,_S_out);
  std::filesystem::__cxx11::path::~path((path *)local_120);
  std::filesystem::__cxx11::path::~path((path *)local_a8);
  std::__cxx11::string::~string((string *)local_40);
  return (ofstream *)CONCAT44(in_register_0000003c,argc);
}

Assistant:

std::ofstream getOutputFile(int argc, char** argv)
{
    std::cout << "Parsing  command line arguments....\n";
    std::string outputFileName = "out.cpp";
    if (argc > 1) {
        std::cout << "Arguments found...\n";
        for (int i = 1; i < argc; i++) {
            if (std::string(argv[i]) == "-o") {
                if (argc >= i + 1) {
                    outputFileName = argv[i + 1];
                }
            }
        }
    }
    std::cout << "Finished parsing command line arguments.\n";
    const auto folder = fs::current_path() / "glom_output";
    const auto outputFile = folder / outputFileName;

    if (!fs::exists(folder))
        fs::create_directory(folder);

    if (fs::exists(outputFile)) {
        fs::remove(outputFile);
    }

    std::ofstream outFile(outputFile);
    return outFile;
}